

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

aiNode * __thiscall Assimp::B3DImporter::ReadNODE(B3DImporter *this,aiNode *parent)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> uVar5;
  undefined4 uVar6;
  bool bVar7;
  aiNode *paVar8;
  pointer __p;
  uint *puVar9;
  aiNode **ppaVar10;
  ulong uVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  aiVector3D aVar12;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> nodeAnim;
  aiNode *node;
  aiNode *child;
  ulong local_1e8;
  float local_1dc;
  undefined1 local_1d8 [16];
  vector<aiNode_*,_std::allocator<aiNode_*>_> children;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  float local_178;
  float fStack_174;
  string name;
  aiMatrix4x4t<float> local_148;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4 tform;
  aiQuaternion r;
  aiMatrix4x4 local_70;
  
  ReadString_abi_cxx11_(&name,this);
  aVar12 = ReadVec3(this);
  local_1d8._8_4_ = extraout_XMM0_Dc;
  local_1d8._0_8_ = aVar12._0_8_;
  local_1d8._12_4_ = extraout_XMM0_Dd;
  local_1e8 = CONCAT44(local_1e8._4_4_,aVar12.z);
  aVar12 = ReadVec3(this);
  local_1dc = aVar12.z;
  r = ReadQuat(this);
  uVar6 = local_1d8._4_4_;
  local_148.a2 = 0.0;
  local_148.a3 = 0.0;
  local_148.a4 = 0.0;
  local_148.b1 = 0.0;
  local_148.b3 = 0.0;
  local_148.b4 = 0.0;
  local_148.c1 = 0.0;
  local_148.c2 = 0.0;
  local_148.c4 = 0.0;
  local_148.d1 = 0.0;
  local_148.d2 = 0.0;
  local_148.d3 = 0.0;
  local_148.d4 = 1.0;
  local_178 = aVar12.x;
  fStack_174 = aVar12.y;
  local_148.a1 = local_178;
  local_148.b2 = fStack_174;
  local_148.c3 = local_1dc;
  aiQuaterniont<float>::GetMatrix((aiMatrix3x3t<float> *)&tform,&r);
  local_70.a1 = tform.a1;
  local_70.a2 = tform.a2;
  local_70.a3 = tform.a3;
  local_70.a4 = 0.0;
  local_70.b3 = tform.b2;
  local_70.b4 = 0.0;
  local_70.c1 = tform.b3;
  local_70.c2 = tform.b4;
  temp.a1 = 1.0;
  temp.a2 = 0.0;
  temp.a3 = 0.0;
  local_70.c3 = tform.c1;
  local_70.c4 = 0.0;
  local_70.d1 = 0.0;
  local_70.d2 = 0.0;
  local_70.d3 = 0.0;
  temp.a4 = (float)local_1d8._0_4_;
  temp.b1 = 0.0;
  temp.b2 = 1.0;
  temp.b3 = 0.0;
  temp.b4 = (float)uVar6;
  temp.c1 = 0.0;
  temp.c2 = 0.0;
  local_70.d4 = 1.0;
  temp.c3 = 1.0;
  temp.c4 = (float)local_1e8;
  temp.d3 = 0.0;
  temp.d4 = 1.0;
  temp.d1 = 0.0;
  temp.d2 = 0.0;
  aiMatrix4x4t<float>::operator*=(&temp,&local_70);
  tform.a2 = temp.a2;
  tform.a1 = temp.a1;
  tform.b4 = temp.b4;
  tform.b3 = temp.b3;
  tform.c4 = temp.c4;
  tform.c3 = temp.c3;
  tform.d1 = temp.d1;
  tform.d2 = temp.d2;
  tform.d3 = temp.d3;
  tform.d4 = temp.d4;
  tform.c1 = temp.c1;
  tform.c2 = temp.c2;
  tform.b1 = temp.b1;
  tform.b2 = temp.b2;
  tform.a3 = temp.a3;
  tform.a4 = temp.a4;
  aiMatrix4x4t<float>::operator*=(&tform,&local_148);
  local_1d8._0_8_ =
       (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  paVar8 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar8,&name);
  node = paVar8;
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(&this->_nodes,&node);
  node->mParent = parent;
  (node->mTransformation).a1 = tform.a1;
  (node->mTransformation).a2 = tform.a2;
  (node->mTransformation).a3 = tform.a3;
  (node->mTransformation).a4 = tform.a4;
  (node->mTransformation).b1 = tform.b1;
  (node->mTransformation).b2 = tform.b2;
  (node->mTransformation).b3 = tform.b3;
  (node->mTransformation).b4 = tform.b4;
  (node->mTransformation).c1 = tform.c1;
  (node->mTransformation).c2 = tform.c2;
  (node->mTransformation).c3 = tform.c3;
  (node->mTransformation).c4 = tform.c4;
  (node->mTransformation).d1 = tform.d1;
  (node->mTransformation).d2 = tform.d2;
  (node->mTransformation).d3 = tform.d3;
  (node->mTransformation).d4 = tform.d4;
  nodeAnim._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)0x0;
  local_1d8._0_8_ = (ulong)local_1d8._0_8_ >> 3;
  meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  while ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish[-1] != this->_pos) {
    ReadChunk_abi_cxx11_((string *)&temp,this);
    bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &temp,"MESH");
    if (bVar7) {
      puVar2 = (this->_meshes).
               super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->_meshes).
               super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ReadMESH(this);
      uVar11 = (ulong)((long)puVar3 - (long)puVar2) >> 3;
      while (child = (aiNode *)CONCAT44(child._4_4_,(uint)uVar11),
            (uint)uVar11 <
            (uint)((ulong)((long)(this->_meshes).
                                 super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_meshes).
                                super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&meshes,(value_type_conflict1 *)&child);
        uVar11 = (ulong)((int)child + 1);
      }
    }
    else {
      bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &temp,"BONE");
      if (bVar7) {
        ReadBONE(this,local_1d8._0_4_);
      }
      else {
        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&temp,"ANIM");
        if (bVar7) {
          ReadANIM(this);
        }
        else {
          bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&temp,"KEYS");
          if (bVar7) {
            if ((__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)
                nodeAnim._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)0x0) {
              __p = (pointer)operator_new(0x438);
              (__p->mNodeName).length = 0;
              (__p->mNodeName).data[0] = '\0';
              memset((__p->mNodeName).data + 1,0x1b,0x3ff);
              __p->mRotationKeys = (aiQuatKey *)0x0;
              __p->mNumScalingKeys = 0;
              *(undefined8 *)&__p->mNumPositionKeys = 0;
              *(undefined8 *)((long)&__p->mPositionKeys + 4) = 0;
              __p->mScalingKeys = (aiVectorKey *)0x0;
              __p->mPreState = aiAnimBehaviour_DEFAULT;
              __p->mPostState = aiAnimBehaviour_DEFAULT;
              std::__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::reset
                        ((__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *)&nodeAnim,
                         __p);
              uVar5 = nodeAnim;
              if (nodeAnim._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                  _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)node) {
                uVar1 = (node->mName).length;
                local_1e8 = (ulong)uVar1;
                *(uint *)nodeAnim._M_t.
                         super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                         super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                         super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = uVar1;
                memcpy((void *)((long)nodeAnim._M_t.
                                      super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                                      .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4),
                       (node->mName).data,local_1e8);
                *(undefined1 *)
                 ((long)uVar5._M_t.
                        super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                        super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                        super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4 + local_1e8) = 0
                ;
              }
            }
            ReadKEYS(this,(aiNodeAnim *)
                          nodeAnim._M_t.
                          super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl);
          }
          else {
            bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&temp,"NODE");
            if (bVar7) {
              child = ReadNODE(this,node);
              std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(&children,&child);
            }
          }
        }
      }
    }
    puVar4 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this->_pos = puVar4[-1];
    (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4 + -1;
    std::__cxx11::string::~string((string *)&temp);
  }
  if ((__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)
      nodeAnim._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
      super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
      super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)0x0) {
    std::
    vector<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>,std::allocator<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>>>
    ::emplace_back<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>>
              ((vector<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>,std::allocator<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>>>
                *)&this->_nodeAnims,&nodeAnim);
  }
  node->mNumMeshes =
       (uint)((ulong)((long)meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2);
  puVar9 = to_array<unsigned_int>(this,&meshes);
  node->mMeshes = puVar9;
  node->mNumChildren =
       (uint)((ulong)((long)children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3);
  ppaVar10 = to_array<aiNode*>(this,&children);
  paVar8 = node;
  node->mChildren = ppaVar10;
  std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base
            (&children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(&nodeAnim);
  std::__cxx11::string::~string((string *)&name);
  return paVar8;
}

Assistant:

aiNode *B3DImporter::ReadNODE( aiNode *parent ){

    string name=ReadString();
    aiVector3D t=ReadVec3();
    aiVector3D s=ReadVec3();
    aiQuaternion r=ReadQuat();

    aiMatrix4x4 trans,scale,rot;

    aiMatrix4x4::Translation( t,trans );
    aiMatrix4x4::Scaling( s,scale );
    rot=aiMatrix4x4( r.GetMatrix() );

    aiMatrix4x4 tform=trans * rot * scale;

    int nodeid=static_cast<int>(_nodes.size());

    aiNode *node=new aiNode( name );
    _nodes.push_back( node );

    node->mParent=parent;
    node->mTransformation=tform;

    std::unique_ptr<aiNodeAnim> nodeAnim;
    vector<unsigned> meshes;
    vector<aiNode*> children;

    while( ChunkSize() ){
        string t=ReadChunk();
        if( t=="MESH" ){
            unsigned int n= static_cast<unsigned int>(_meshes.size());
            ReadMESH();
            for( unsigned int i=n;i<static_cast<unsigned int>(_meshes.size());++i ){
                meshes.push_back( i );
            }
        }else if( t=="BONE" ){
            ReadBONE( nodeid );
        }else if( t=="ANIM" ){
            ReadANIM();
        }else if( t=="KEYS" ){
            if( !nodeAnim ){
                nodeAnim.reset(new aiNodeAnim);
                nodeAnim->mNodeName=node->mName;
            }
            ReadKEYS( nodeAnim.get() );
        }else if( t=="NODE" ){
            aiNode *child=ReadNODE( node );
            children.push_back( child );
        }
        ExitChunk();
    }

    if (nodeAnim) {
        _nodeAnims.emplace_back( std::move(nodeAnim) );
    }

    node->mNumMeshes= static_cast<unsigned int>(meshes.size());
    node->mMeshes=to_array( meshes );

    node->mNumChildren=static_cast<unsigned int>(children.size());
    node->mChildren=to_array( children );

    return node;
}